

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUpsize.c
# Opt level: O0

void Abc_SclUpsizePerformInt(SC_Lib *pLib,Abc_Ntk_t *pNtk,SC_SizePars *pPars)

{
  int iVar1;
  int nPathNodes;
  abctime aVar2;
  SC_Man *p_00;
  Vec_Int_t *pVVar3;
  abctime aVar4;
  float fVar5;
  double local_148;
  double local_138;
  double local_128;
  double local_118;
  double local_108;
  int local_f8;
  int local_ec;
  int local_e0;
  int local_d4;
  bool local_b9;
  bool local_95;
  long local_88;
  Vec_Int_t *t;
  Vec_Int_t *vTFO;
  int local_68;
  int nAllUpsizes;
  int nAllTfos;
  int nAllNodes;
  int nAllPos;
  int nConeSize;
  int nFramesNoChange;
  int nUpsizes;
  int win;
  int i;
  abctime nRuntimeLimit;
  abctime clk;
  Vec_Int_t *vPathNodes;
  Vec_Int_t *vPathPos;
  SC_Man *p;
  SC_SizePars *pPars_local;
  Abc_Ntk_t *pNtk_local;
  SC_Lib *pLib_local;
  
  vPathNodes = (Vec_Int_t *)0x0;
  clk = 0;
  if (pPars->TimeOut == 0) {
    local_88 = 0;
  }
  else {
    iVar1 = pPars->TimeOut;
    aVar2 = Abc_Clock();
    local_88 = (long)iVar1 * 1000000 + aVar2;
  }
  nUpsizes = 0;
  nConeSize = -1;
  nAllPos = 0;
  nAllNodes = 0;
  if (pPars->fVerbose != 0) {
    printf("Parameters: ");
    printf("Iters =%5d.  ",(ulong)(uint)pPars->nIters);
    printf("Time win =%3d %%. ",(ulong)(uint)pPars->Window);
    printf("Update ratio =%3d %%. ",(ulong)(uint)pPars->Ratio);
    printf("UseDept =%2d. ",(ulong)(uint)pPars->fUseDept);
    printf("UseWL =%2d. ",(ulong)(uint)pPars->fUseWireLoads);
    printf("Target =%5d ps. ",(ulong)(uint)pPars->DelayUser);
    printf("DelayGap =%3d ps. ",(ulong)(uint)pPars->DelayGap);
    printf("Timeout =%4d sec",(ulong)(uint)pPars->TimeOut);
    printf("\n");
  }
  if (pPars->Window == 1) {
    iVar1 = Abc_NtkNodeNum(pNtk);
    pPars->Window = (uint)(40000 < iVar1) + pPars->Window;
  }
  p_00 = Abc_SclManStart(pLib,pNtk,pPars->fUseWireLoads,pPars->fUseDept,0.0,pPars->BuffTreeEst);
  aVar2 = Abc_Clock();
  p_00->timeTotal = aVar2;
  if (p_00->vGatesBest != (Vec_Int_t *)0x0) {
    __assert_fail("p->vGatesBest == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUpsize.c"
                  ,0x37f,"void Abc_SclUpsizePerformInt(SC_Lib *, Abc_Ntk_t *, SC_SizePars *)");
  }
  pVVar3 = Vec_IntDup(p_00->pNtk->vGates);
  p_00->vGatesBest = pVVar3;
  p_00->BestDelay = p_00->MaxDelay0;
  vTFO._4_4_ = 0;
  local_68 = 0;
  nAllUpsizes = 0;
  nAllTfos = 0;
  if ((float)pPars->DelayUser < p_00->BestDelay) {
    for (nUpsizes = 0; nUpsizes < pPars->nIters; nUpsizes = nUpsizes + 1) {
      for (nFramesNoChange = pPars->Window + (uint)(nUpsizes % 7 == 6); nFramesNoChange < 0x65;
          nFramesNoChange = nFramesNoChange << 1) {
        aVar2 = Abc_Clock();
        vPathNodes = Abc_SclFindCriticalCoWindow(p_00,nFramesNoChange);
        clk = (abctime)Abc_SclFindCriticalNodeWindow
                                 (p_00,vPathNodes,nFramesNoChange,pPars->fUseDept);
        aVar4 = Abc_Clock();
        p_00->timeCone = (aVar4 - aVar2) + p_00->timeCone;
        aVar2 = Abc_Clock();
        if (((pPars->BypassFreq == 0) || (nUpsizes == 0)) || (nUpsizes % pPars->BypassFreq != 0)) {
          nConeSize = Abc_SclFindUpsizes(p_00,(Vec_Int_t *)clk,pPars->Ratio,pPars->Notches,nUpsizes,
                                         pPars->DelayGap,(uint)(0 < pPars->BypassFreq));
        }
        else {
          nConeSize = Abc_SclFindBypasses(p_00,(Vec_Int_t *)clk,pPars->Ratio,pPars->Notches,nUpsizes
                                          ,pPars->DelayGap,pPars->fVeryVerbose);
        }
        aVar4 = Abc_Clock();
        p_00->timeSize = (aVar4 - aVar2) + p_00->timeSize;
        aVar2 = Abc_Clock();
        Abc_SclUnmarkCriticalNodeWindow(p_00,(Vec_Int_t *)clk);
        Abc_SclUnmarkCriticalNodeWindow(p_00,vPathNodes);
        aVar4 = Abc_Clock();
        p_00->timeCone = (aVar4 - aVar2) + p_00->timeCone;
        if (0 < nConeSize) break;
        Vec_IntFree(vPathNodes);
        Vec_IntFree((Vec_Int_t *)clk);
      }
      if (nConeSize == 0) break;
      aVar2 = Abc_Clock();
      if (pPars->fUseDept == 0) {
        pVVar3 = Abc_SclFindTFO(p_00->pNtk,(Vec_Int_t *)clk);
        Abc_SclTimeCone(p_00,pVVar3);
        nAllNodes = Vec_IntSize(pVVar3);
        Vec_IntFree(pVVar3);
      }
      else {
        iVar1 = Vec_IntSize(p_00->vChanged);
        if ((iVar1 == 0) ||
           (((pPars->BypassFreq != 0 && (nUpsizes != 0)) && (nUpsizes % pPars->BypassFreq == 0)))) {
          Abc_SclTimeNtkRecompute(p_00,(float *)0x0,(float *)0x0,pPars->fUseDept,0.0);
        }
        else {
          nAllNodes = Abc_SclTimeIncUpdate(p_00);
        }
      }
      aVar4 = Abc_Clock();
      p_00->timeTime = (aVar4 - aVar2) + p_00->timeTime;
      fVar5 = Abc_SclReadMaxDelay(p_00);
      p_00->MaxDelay = fVar5;
      if (p_00->BestDelay < p_00->MaxDelay || p_00->BestDelay == p_00->MaxDelay) {
        nAllPos = nAllPos + 1;
      }
      else {
        p_00->BestDelay = p_00->MaxDelay;
        Abc_SclApplyUpdateToBest(p_00->vGatesBest,p_00->pNtk->vGates,p_00->vUpdates);
        Vec_IntClear(p_00->vUpdates2);
        nAllPos = 0;
      }
      iVar1 = Vec_IntSize(vPathNodes);
      nPathNodes = Vec_IntSize((Vec_Int_t *)clk);
      local_95 = true;
      if (pPars->fVeryVerbose == 0) {
        local_b9 = pPars->fVerbose != 0 && nAllPos == 0;
        local_95 = local_b9;
      }
      Abc_SclUpsizePrint(p_00,nUpsizes,nFramesNoChange,iVar1,nPathNodes,nConeSize,nAllNodes,
                         (uint)local_95);
      iVar1 = Vec_IntSize(vPathNodes);
      nAllTfos = iVar1 + nAllTfos;
      iVar1 = Vec_IntSize((Vec_Int_t *)clk);
      nAllUpsizes = iVar1 + nAllUpsizes;
      local_68 = nAllNodes + local_68;
      vTFO._4_4_ = nConeSize + vTFO._4_4_;
      Vec_IntFree(vPathNodes);
      Vec_IntFree((Vec_Int_t *)clk);
      if (((local_88 != 0) && (aVar2 = Abc_Clock(), local_88 < aVar2)) ||
         ((pPars->nIterNoChange < nAllPos || (p_00->BestDelay <= (float)pPars->DelayUser)))) break;
    }
  }
  else {
    printf("Current delay (%.2f ps) does not exceed the target delay (%.2f ps). Upsizing is not performed.\n"
           ,(double)p_00->BestDelay,(double)pPars->DelayUser);
  }
  pVVar3 = p_00->vGatesBest;
  p_00->vGatesBest = p_00->pNtk->vGates;
  p_00->pNtk->vGates = pVVar3;
  if (pPars->BypassFreq != 0) {
    Abc_SclUndoRecentChanges(p_00->pNtk,p_00->vUpdates2);
  }
  if (pPars->BypassFreq != 0) {
    Abc_SclUpsizeRemoveDangling(p_00,pNtk);
  }
  Abc_SclTimeNtkRecompute(p_00,&p_00->SumArea,&p_00->MaxDelay,0,0.0);
  if (pPars->fVerbose == 0) {
    printf(
          "                                                                                                                                                  \r"
          );
  }
  else {
    if (nUpsizes == 0) {
      local_d4 = 1;
    }
    else {
      local_d4 = nUpsizes;
    }
    if (nUpsizes == 0) {
      local_e0 = 1;
    }
    else {
      local_e0 = nUpsizes;
    }
    if (nUpsizes == 0) {
      local_ec = 1;
    }
    else {
      local_ec = nUpsizes;
    }
    if (nUpsizes == 0) {
      local_f8 = 1;
    }
    else {
      local_f8 = nUpsizes;
    }
    Abc_SclUpsizePrint(p_00,nUpsizes,pPars->Window,nAllTfos / local_d4,nAllUpsizes / local_e0,
                       vTFO._4_4_ / local_ec,local_68 / local_f8,1);
  }
  aVar2 = Abc_Clock();
  p_00->timeTotal = aVar2 - p_00->timeTotal;
  if (pPars->fVerbose != 0) {
    p_00->timeOther = ((p_00->timeTotal - p_00->timeCone) - p_00->timeSize) - p_00->timeTime;
    Abc_Print(1,"%s =","Runtime: Critical path");
    if (((double)p_00->timeTotal != 0.0) || (NAN((double)p_00->timeTotal))) {
      local_108 = ((double)p_00->timeCone * 100.0) / (double)p_00->timeTotal;
    }
    else {
      local_108 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p_00->timeCone * 1.0) / 1000000.0,local_108);
    Abc_Print(1,"%s =","Runtime: Sizing eval  ");
    if (((double)p_00->timeTotal != 0.0) || (NAN((double)p_00->timeTotal))) {
      local_118 = ((double)p_00->timeSize * 100.0) / (double)p_00->timeTotal;
    }
    else {
      local_118 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p_00->timeSize * 1.0) / 1000000.0,local_118);
    Abc_Print(1,"%s =","Runtime: Timing update");
    if (((double)p_00->timeTotal != 0.0) || (NAN((double)p_00->timeTotal))) {
      local_128 = ((double)p_00->timeTime * 100.0) / (double)p_00->timeTotal;
    }
    else {
      local_128 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p_00->timeTime * 1.0) / 1000000.0,local_128);
    Abc_Print(1,"%s =","Runtime: Other        ");
    if (((double)p_00->timeTotal != 0.0) || (NAN((double)p_00->timeTotal))) {
      local_138 = ((double)p_00->timeOther * 100.0) / (double)p_00->timeTotal;
    }
    else {
      local_138 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p_00->timeOther * 1.0) / 1000000.0,local_138);
    Abc_Print(1,"%s =","Runtime: TOTAL        ");
    if (((double)p_00->timeTotal != 0.0) || (NAN((double)p_00->timeTotal))) {
      local_148 = ((double)p_00->timeTotal * 100.0) / (double)p_00->timeTotal;
    }
    else {
      local_148 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p_00->timeTotal * 1.0) / 1000000.0,local_148);
  }
  if (pPars->fDumpStats != 0) {
    Abc_SclDumpStats(p_00,"stats2.txt",p_00->timeTotal);
  }
  if ((local_88 != 0) && (aVar2 = Abc_Clock(), local_88 < aVar2)) {
    printf("Gate sizing timed out at %d seconds.\n",(ulong)(uint)pPars->TimeOut);
  }
  Abc_SclSclGates2MioGates(pLib,pNtk);
  Abc_SclManFree(p_00);
  return;
}

Assistant:

void Abc_SclUpsizePerformInt( SC_Lib * pLib, Abc_Ntk_t * pNtk, SC_SizePars * pPars )
{
    SC_Man * p;
    Vec_Int_t * vPathPos = NULL;    // critical POs
    Vec_Int_t * vPathNodes = NULL;  // critical nodes and PIs
    abctime clk, nRuntimeLimit = pPars->TimeOut ? pPars->TimeOut * CLOCKS_PER_SEC + Abc_Clock() : 0;
    int i = 0, win, nUpsizes = -1, nFramesNoChange = 0, nConeSize = 0;
    int nAllPos, nAllNodes, nAllTfos, nAllUpsizes;
    if ( pPars->fVerbose )
    {
        printf( "Parameters: " );
        printf( "Iters =%5d.  ",          pPars->nIters   );
        printf( "Time win =%3d %%. ",     pPars->Window   );
        printf( "Update ratio =%3d %%. ", pPars->Ratio    );
        printf( "UseDept =%2d. ",         pPars->fUseDept );
        printf( "UseWL =%2d. ",           pPars->fUseWireLoads );
        printf( "Target =%5d ps. ",       pPars->DelayUser );
        printf( "DelayGap =%3d ps. ",     pPars->DelayGap );
        printf( "Timeout =%4d sec",       pPars->TimeOut  );
        printf( "\n" );
    }
    // increase window for larger networks
    if ( pPars->Window == 1 )
        pPars->Window += (Abc_NtkNodeNum(pNtk) > 40000);
    // prepare the manager; collect init stats
    p = Abc_SclManStart( pLib, pNtk, pPars->fUseWireLoads, pPars->fUseDept, 0, pPars->BuffTreeEst );
    p->timeTotal  = Abc_Clock();
    assert( p->vGatesBest == NULL );
    p->vGatesBest = Vec_IntDup( p->pNtk->vGates );
    p->BestDelay  = p->MaxDelay0;
    // perform upsizing
    nAllPos = nAllNodes = nAllTfos = nAllUpsizes = 0;
    if ( p->BestDelay <= pPars->DelayUser )
        printf( "Current delay (%.2f ps) does not exceed the target delay (%.2f ps). Upsizing is not performed.\n", p->BestDelay, (float)pPars->DelayUser );
    else
    for ( i = 0; i < pPars->nIters; i++ )
    {
        for ( win = pPars->Window + ((i % 7) == 6); win <= 100;  win *= 2 )
        {
            // detect critical path
            clk = Abc_Clock();
            vPathPos   = Abc_SclFindCriticalCoWindow( p, win );
            vPathNodes = Abc_SclFindCriticalNodeWindow( p, vPathPos, win, pPars->fUseDept );
            p->timeCone += Abc_Clock() - clk;

            // selectively upsize the nodes
            clk = Abc_Clock();
            if ( pPars->BypassFreq && i && (i % pPars->BypassFreq) == 0 )
                nUpsizes = Abc_SclFindBypasses( p, vPathNodes, pPars->Ratio, pPars->Notches, i, pPars->DelayGap, pPars->fVeryVerbose );
            else
                nUpsizes = Abc_SclFindUpsizes( p, vPathNodes, pPars->Ratio, pPars->Notches, i, pPars->DelayGap, (pPars->BypassFreq > 0) );
            p->timeSize += Abc_Clock() - clk;

            // unmark critical path
            clk = Abc_Clock();
            Abc_SclUnmarkCriticalNodeWindow( p, vPathNodes );
            Abc_SclUnmarkCriticalNodeWindow( p, vPathPos );
            p->timeCone += Abc_Clock() - clk;
            if ( nUpsizes > 0 )
                break;
            Vec_IntFree( vPathPos );
            Vec_IntFree( vPathNodes );
        }
        if ( nUpsizes == 0 )
            break;

        // update timing information
        clk = Abc_Clock();
        if ( pPars->fUseDept )
        {
            if ( Vec_IntSize(p->vChanged) && !(pPars->BypassFreq && i && (i % pPars->BypassFreq) == 0) )
                nConeSize = Abc_SclTimeIncUpdate( p );
            else
                Abc_SclTimeNtkRecompute( p, NULL, NULL, pPars->fUseDept, 0 );
        }
        else
        {
            Vec_Int_t * vTFO = Abc_SclFindTFO( p->pNtk, vPathNodes );
            Abc_SclTimeCone( p, vTFO );
            nConeSize = Vec_IntSize( vTFO );
            Vec_IntFree( vTFO );
        }
        p->timeTime += Abc_Clock() - clk;
//        Abc_SclUpsizePrintDiffs( p, pLib, pNtk );

        // save the best network
        p->MaxDelay = Abc_SclReadMaxDelay( p );
        if ( p->BestDelay > p->MaxDelay )
        {
            p->BestDelay = p->MaxDelay;
            Abc_SclApplyUpdateToBest( p->vGatesBest, p->pNtk->vGates, p->vUpdates );
            Vec_IntClear( p->vUpdates2 );
            nFramesNoChange = 0;
        }
        else
            nFramesNoChange++;

        // report and cleanup
        Abc_SclUpsizePrint( p, i, win, Vec_IntSize(vPathPos), Vec_IntSize(vPathNodes), nUpsizes, nConeSize, pPars->fVeryVerbose || (pPars->fVerbose && nFramesNoChange == 0) ); //|| (i == nIters-1) );
        nAllPos     += Vec_IntSize(vPathPos);
        nAllNodes   += Vec_IntSize(vPathNodes);
        nAllTfos    += nConeSize;
        nAllUpsizes += nUpsizes;
        Vec_IntFree( vPathPos );
        Vec_IntFree( vPathNodes );
        // check timeout
        if ( nRuntimeLimit && Abc_Clock() > nRuntimeLimit )
            break;
        // check no change
        if ( nFramesNoChange > pPars->nIterNoChange )
            break;
        // check best delay
        if ( p->BestDelay <= pPars->DelayUser )
            break;
    }
    // update for best gates and recompute timing
    ABC_SWAP( Vec_Int_t *, p->vGatesBest, p->pNtk->vGates );
    if ( pPars->BypassFreq != 0 )
        Abc_SclUndoRecentChanges( p->pNtk, p->vUpdates2 );
    if ( pPars->BypassFreq != 0 )
        Abc_SclUpsizeRemoveDangling( p, pNtk );
    Abc_SclTimeNtkRecompute( p, &p->SumArea, &p->MaxDelay, 0, 0 );
    if ( pPars->fVerbose )
        Abc_SclUpsizePrint( p, i, pPars->Window, nAllPos/(i?i:1), nAllNodes/(i?i:1), nAllUpsizes/(i?i:1), nAllTfos/(i?i:1), 1 );
    else
        printf( "                                                                                                                                                  \r" );
    // report runtime
    p->timeTotal = Abc_Clock() - p->timeTotal;
    if ( pPars->fVerbose )
    {
        p->timeOther = p->timeTotal - p->timeCone - p->timeSize - p->timeTime;
        ABC_PRTP( "Runtime: Critical path", p->timeCone,  p->timeTotal );
        ABC_PRTP( "Runtime: Sizing eval  ", p->timeSize,  p->timeTotal );
        ABC_PRTP( "Runtime: Timing update", p->timeTime,  p->timeTotal );
        ABC_PRTP( "Runtime: Other        ", p->timeOther, p->timeTotal );
        ABC_PRTP( "Runtime: TOTAL        ", p->timeTotal, p->timeTotal );
    }
    if ( pPars->fDumpStats )
        Abc_SclDumpStats( p, "stats2.txt", p->timeTotal );
    if ( nRuntimeLimit && Abc_Clock() > nRuntimeLimit )
        printf( "Gate sizing timed out at %d seconds.\n", pPars->TimeOut );

    // save the result and quit
    Abc_SclSclGates2MioGates( pLib, pNtk ); // updates gate pointers
    Abc_SclManFree( p );
//    Abc_NtkCleanMarkAB( pNtk );
}